

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall sf::String::String(String *this,char ansiChar,locale *locale)

{
  undefined1 in_SIL;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *in_RDI;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *this_00
  ;
  undefined7 in_stack_fffffffffffffff0;
  
  this_00 = in_RDI;
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                *)CONCAT17(in_SIL,in_stack_fffffffffffffff0));
  Utf<32U>::decodeAnsi<char>((char)((ulong)this_00 >> 0x38),(locale *)in_RDI);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  operator+=(this_00,(uint)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

String::String(char ansiChar, const std::locale& locale)
{
    m_string += Utf32::decodeAnsi(ansiChar, locale);
}